

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O3

void __thiscall Clasp::SatElite::doExtendModel(SatElite *this,ValueVec *m,LitVec *unconstr)

{
  uint uVar1;
  pointer puVar2;
  byte bVar3;
  ulong in_RAX;
  pointer pLVar4;
  uint uVar5;
  pointer pLVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Clause *pCVar15;
  uint uVar16;
  undefined8 uStack_38;
  
  pCVar15 = (this->super_SatPreprocessor).elimTop_;
  if (pCVar15 != (Clause *)0x0) {
    uVar10 = (unconstr->ebo_).size;
    uVar14 = (ulong)uVar10;
    uVar16 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = pCVar15->lits_[0].rep_;
      uVar5 = uVar1 >> 2;
      if (-1 < *(int *)&pCVar15->field_0x8) {
        (m->ebo_).buf[uVar5] = '\x04';
      }
      bVar3 = 1;
      uVar9 = uVar1;
      uVar11 = uVar10;
      if ((uVar16 != uVar10) &&
         (uVar7 = (unconstr->ebo_).buf[uVar16].rep_, uVar11 = uVar16, uVar7 >> 2 == uVar5)) {
        (m->ebo_).buf[uVar5] = '\x02' - ((uVar7 & 2) == 0);
        bVar3 = 0;
        uVar11 = uVar16 + 1;
      }
      do {
        uVar16 = uVar11;
        puVar2 = (m->ebo_).buf;
        if ((bool)(puVar2[uVar9 >> 2] != (uchar)('\x02' - ((uVar9 & 2) == 0)) & bVar3)) {
          uVar7 = *(uint *)&pCVar15->field_0x8 & 0x3fffffff;
          uVar11 = uVar9;
          if (uVar7 != 1) {
            uVar13 = 1;
            do {
              uVar11 = pCVar15->lits_[uVar13].rep_;
              if ((byte)(puVar2[uVar11 >> 2] & 3) != (byte)(((uVar11 & 2) == 0) + 1U)) break;
              uVar12 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar12;
              uVar11 = uVar9;
            } while (uVar7 != uVar12);
          }
          bVar3 = 1;
          if ((pCVar15->lits_[0].rep_ ^ uVar11) < 2) {
            puVar2[uVar11 >> 2] = '\x02' - ((uVar11 & 2) == 0);
            bVar3 = 0;
          }
        }
        pCVar15 = (pCVar15->data_).next;
      } while ((pCVar15 != (Clause *)0x0) &&
              (uVar9 = pCVar15->lits_[0].rep_, uVar11 = uVar16, uVar9 >> 2 == uVar5));
      puVar2 = (m->ebo_).buf;
      if (puVar2[uVar5] == '\x04') {
        puVar2[uVar5] = '\x05';
        uStack_38 = CONCAT44(uVar1,(undefined4)uStack_38) & 0xfffffffcffffffff;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (unconstr,(Literal *)((long)&uStack_38 + 4));
      }
    } while (pCVar15 != (Clause *)0x0);
    pLVar6 = (unconstr->ebo_).buf;
    pLVar4 = pLVar6 + uVar14;
    uVar16 = (unconstr->ebo_).size;
    if (uVar10 != uVar16) {
      lVar8 = uVar14 * 4;
      do {
        uVar10 = *(uint *)((long)&pLVar6->rep_ + lVar8) >> 2;
        puVar2 = (m->ebo_).buf;
        if ((puVar2[uVar10] & 4) != 0) {
          puVar2[uVar10] = '\x01';
          pLVar4->rep_ = *(uint32 *)((long)&pLVar6->rep_ + lVar8);
          pLVar4 = pLVar4 + 1;
        }
        lVar8 = lVar8 + 4;
      } while ((ulong)uVar16 << 2 != lVar8);
      pLVar6 = (unconstr->ebo_).buf;
      uVar14 = (ulong)(unconstr->ebo_).size;
    }
    (unconstr->ebo_).size = (int)uVar14 - (int)((long)pLVar6 + (uVar14 * 4 - (long)pLVar4) >> 2);
  }
  return;
}

Assistant:

void SatElite::doExtendModel(ValueVec& m, LitVec& unconstr) {
	if (!elimTop_) return;
	const ValueRep value_eliminated = 4u;
	// compute values of eliminated vars / blocked literals by "unit propagating"
	// eliminated/blocked clauses in reverse order
	uint32 uv = 0;
	uint32 us = unconstr.size();
	Clause* r = elimTop_;
	do {
		Literal x  = (*r)[0];
		Var last   = x.var();
		bool check = true;
		if (!r->marked()) {
			// eliminated var - compute the implied value
			m[last] = value_eliminated;
		}
		if (uv != us && unconstr[uv].var() == last) {
			// last is unconstrained w.r.t the current model -
			// set remembered value
			check   = false;
			m[last] = trueValue(unconstr[uv]);
			++uv;
		}
		do {
			Clause& c = *r;
			if (m[x.var()] != trueValue(x) && check) {
				for (uint32 i = 1, end = c.size(); i != end; ++i) {
					ValueRep vi = m[c[i].var()] & 3u;
					if (vi != falseValue(c[i])) {
						x = c[i];
						break;
					}
				}
				if (x == c[0]) {
					// all lits != x are false
					// clause is unit or conflicting
					assert(c.marked() || m[x.var()] != falseValue(x));
					m[x.var()] = trueValue(x);
					check      = false;
				}
			}
			r = r->next();
		} while (r && (x = (*r)[0]).var() == last);
		if (m[last] == value_eliminated) {
			// last seems unconstrained w.r.t the model
			m[last] |= value_true;
			unconstr.push_back(posLit(last));
		}
	} while (r);
	// check whether newly added unconstrained vars are really unconstrained w.r.t the model
	// or if they are implied by some blocked clause.
	LitVec::iterator j = unconstr.begin()+us;
	for (LitVec::iterator it = j, end = unconstr.end(); it != end; ++it) {
		if ((m[it->var()] & value_eliminated) != 0) {
			// var is unconstrained - assign to true and remember it
			// so that we can later enumerate the model containing ~var
			m[it->var()] = value_true;
			*j++ = *it;
		}
	}
	unconstr.erase(j, unconstr.end());
}